

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

type fmt::v5::format_to<std::ostream_iterator<char,char,std::char_traits<char>>,char[3],int>
               (ostream_iterator<char,_char,_std::char_traits<char>_> *out,char (*format_str) [3],
               int *args)

{
  type args_00;
  basic_string_view<char> *in_RCX;
  ostream_iterator<char,_char,_std::char_traits<char>_> *in_RDX;
  ostream_iterator<char,_char,_std::char_traits<char>_> *in_RSI;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>_2
  in_RDI;
  type tVar1;
  format_arg_store<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>,_int>
  as;
  format_arg_store<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>,_int>
  *in_stack_ffffffffffffff78;
  ostream_iterator<char,_char,_std::char_traits<char>_> local_48 [2];
  ostream_iterator<char,_char,_std::char_traits<char>_> *poVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>_2
  aVar3;
  
  poVar2 = in_RSI;
  aVar3 = in_RDI;
  internal::check_format_string<int,char[3]>((char (*) [3])in_RDX);
  format_arg_store<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>,_int>
  ::format_arg_store((format_arg_store<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>,_int>
                      *)in_RSI,(int *)in_stack_ffffffffffffff78);
  std::ostream_iterator<char,_char,_std::char_traits<char>_>::ostream_iterator(local_48,in_RSI);
  to_string_view<char>((char *)0x19e222);
  basic_format_args<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
  ::basic_format_args<int>
            ((basic_format_args<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
              *)in_RSI,in_stack_ffffffffffffff78);
  args_00.field_1.values_ = aVar3.values_;
  args_00.types_ = (unsigned_long_long)poVar2;
  tVar1 = vformat_to<fmt::v5::basic_string_view<char>,std::ostream_iterator<char,char,std::char_traits<char>>>
                    (in_RDX,in_RCX,args_00);
  tVar1._M_stream = (ostream_type *)in_RDI.values_;
  return tVar1;
}

Assistant:

format_to(OutputIt out, const S &format_str, const Args &... args) {
  internal::check_format_string<Args...>(format_str);
  typedef typename format_context_t<OutputIt, FMT_CHAR(S)>::type context;
  format_arg_store<context, Args...> as{args...};
  return vformat_to(out, to_string_view(format_str),
                    basic_format_args<context>(as));
}